

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O3

int __thiscall
btTriangleMesh::findOrAddVertex(btTriangleMesh *this,btVector3 *vertex,bool removeDuplicateVertices)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  btVector3 *ptr;
  btIndexedMesh *pbVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  btVector3 *pbVar9;
  float *pfVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  btScalar *pbVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  if (this->m_use4componentVertices == true) {
    uVar6 = (this->m_4componentVertices).m_size;
    if (removeDuplicateVertices && 0 < (int)uVar6) {
      pbVar15 = ((this->m_4componentVertices).m_data)->m_floats + 2;
      uVar8 = 0;
      do {
        fVar19 = ((btVector3 *)(pbVar15 + -2))->m_floats[0] - vertex->m_floats[0];
        fVar20 = pbVar15[-1] - vertex->m_floats[1];
        fVar21 = *pbVar15 - vertex->m_floats[2];
        if (fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20 <= this->m_weldingThreshold)
        goto LAB_0016c403;
        uVar8 = uVar8 + 1;
        pbVar15 = pbVar15 + 4;
      } while (uVar6 != uVar8);
    }
    piVar1 = &((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_numVertices;
    *piVar1 = *piVar1 + 1;
    if (uVar6 == (this->m_4componentVertices).m_capacity) {
      iVar7 = 1;
      if (uVar6 != 0) {
        iVar7 = uVar6 * 2;
      }
      if ((int)uVar6 < iVar7) {
        if (iVar7 == 0) {
          pbVar9 = (btVector3 *)0x0;
        }
        else {
          pbVar9 = (btVector3 *)btAlignedAllocInternal((long)iVar7 << 4,0x10);
          uVar6 = (this->m_4componentVertices).m_size;
        }
        if (0 < (int)uVar6) {
          lVar12 = 0;
          do {
            puVar2 = (undefined8 *)((long)((this->m_4componentVertices).m_data)->m_floats + lVar12);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)pbVar9->m_floats + lVar12);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
            lVar12 = lVar12 + 0x10;
          } while ((ulong)uVar6 << 4 != lVar12);
        }
        ptr = (this->m_4componentVertices).m_data;
        if ((ptr != (btVector3 *)0x0) && ((this->m_4componentVertices).m_ownsMemory == true)) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_4componentVertices).m_ownsMemory = true;
        (this->m_4componentVertices).m_data = pbVar9;
        (this->m_4componentVertices).m_capacity = iVar7;
        uVar6 = (this->m_4componentVertices).m_size;
      }
    }
    uVar5 = *(undefined8 *)(vertex->m_floats + 2);
    pbVar9 = (this->m_4componentVertices).m_data + (int)uVar6;
    *(undefined8 *)pbVar9->m_floats = *(undefined8 *)vertex->m_floats;
    *(undefined8 *)(pbVar9->m_floats + 2) = uVar5;
    uVar6 = (this->m_4componentVertices).m_size;
    uVar8 = (ulong)uVar6;
    (this->m_4componentVertices).m_size = uVar6 + 1;
    ((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_vertexBase =
         (uchar *)(this->m_4componentVertices).m_data;
    goto LAB_0016c403;
  }
  uVar6 = (this->m_3componentVertices).m_size;
  if (removeDuplicateVertices && 0 < (int)uVar6) {
    pfVar10 = (this->m_3componentVertices).m_data;
    uVar8 = 0;
    do {
      fVar19 = pfVar10[uVar8] - vertex->m_floats[0];
      fVar20 = pfVar10[uVar8 + 1] - vertex->m_floats[1];
      fVar21 = pfVar10[uVar8 + 2] - vertex->m_floats[2];
      if (fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20 <= this->m_weldingThreshold) {
        uVar8 = (uVar8 & 0xffffffff) / 3;
        goto LAB_0016c403;
      }
      uVar8 = uVar8 + 3;
    } while ((int)uVar8 < (int)uVar6);
  }
  uVar17 = (this->m_3componentVertices).m_capacity;
  if (uVar6 == uVar17) {
    uVar16 = 1;
    if (uVar6 != 0) {
      uVar16 = uVar6 * 2;
    }
    uVar17 = uVar6;
    if ((int)uVar6 < (int)uVar16) {
      if (uVar16 == 0) {
        pfVar10 = (float *)0x0;
      }
      else {
        pfVar10 = (float *)btAlignedAllocInternal((long)(int)uVar16 << 2,0x10);
        uVar6 = (this->m_3componentVertices).m_size;
      }
      pfVar11 = (this->m_3componentVertices).m_data;
      if ((int)uVar6 < 1) {
        if (pfVar11 != (float *)0x0) goto LAB_0016c222;
      }
      else {
        uVar8 = 0;
        do {
          pfVar10[uVar8] = pfVar11[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
LAB_0016c222:
        if ((this->m_3componentVertices).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar11);
          uVar6 = (this->m_3componentVertices).m_size;
        }
      }
      (this->m_3componentVertices).m_ownsMemory = true;
      (this->m_3componentVertices).m_data = pfVar10;
      (this->m_3componentVertices).m_capacity = uVar16;
      uVar17 = uVar16;
    }
  }
  pfVar10 = (this->m_3componentVertices).m_data;
  pfVar10[(int)uVar6] = vertex->m_floats[0];
  uVar6 = uVar6 + 1;
  (this->m_3componentVertices).m_size = uVar6;
  if (uVar6 == uVar17) {
    uVar8 = 1;
    if (uVar17 != 0) {
      uVar8 = (ulong)(uVar17 * 2);
    }
    iVar7 = (int)uVar8;
    if ((int)uVar17 < iVar7) {
      if (iVar7 == 0) {
        pfVar11 = (float *)0x0;
      }
      else {
        pfVar11 = (float *)btAlignedAllocInternal((long)iVar7 << 2,0x10);
        uVar17 = (this->m_3componentVertices).m_size;
        pfVar10 = (this->m_3componentVertices).m_data;
      }
      if ((int)uVar17 < 1) {
        if (pfVar10 != (float *)0x0) goto LAB_0016c2e1;
      }
      else {
        uVar13 = 0;
        do {
          pfVar11[uVar13] = pfVar10[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar17 != uVar13);
LAB_0016c2e1:
        if ((this->m_3componentVertices).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar10);
          uVar17 = (this->m_3componentVertices).m_size;
        }
      }
      (this->m_3componentVertices).m_ownsMemory = true;
      (this->m_3componentVertices).m_data = pfVar11;
      (this->m_3componentVertices).m_capacity = iVar7;
      pfVar10 = pfVar11;
    }
    else {
      uVar8 = (ulong)uVar17;
    }
  }
  else {
    uVar8 = (ulong)uVar17;
    uVar17 = uVar6;
  }
  pfVar10[(int)uVar17] = vertex->m_floats[1];
  iVar7 = uVar17 + 1;
  (this->m_3componentVertices).m_size = iVar7;
  iVar18 = (int)uVar8;
  if (iVar7 == iVar18) {
    iVar14 = 1;
    if (iVar18 != 0) {
      iVar14 = iVar18 * 2;
    }
    iVar7 = iVar18;
    if (iVar18 < iVar14) {
      if (iVar14 == 0) {
        pfVar11 = (float *)0x0;
      }
      else {
        pfVar11 = (float *)btAlignedAllocInternal((long)iVar14 << 2,0x10);
        uVar8 = (ulong)(uint)(this->m_3componentVertices).m_size;
        pfVar10 = (this->m_3componentVertices).m_data;
      }
      iVar7 = (int)uVar8;
      if (iVar7 < 1) {
        if (pfVar10 != (float *)0x0) goto LAB_0016c39b;
      }
      else {
        uVar13 = 0;
        do {
          pfVar11[uVar13] = pfVar10[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar8 != uVar13);
LAB_0016c39b:
        if ((this->m_3componentVertices).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar10);
          iVar7 = (this->m_3componentVertices).m_size;
        }
      }
      (this->m_3componentVertices).m_ownsMemory = true;
      (this->m_3componentVertices).m_data = pfVar11;
      (this->m_3componentVertices).m_capacity = iVar14;
      pfVar10 = pfVar11;
    }
  }
  pfVar10[iVar7] = vertex->m_floats[2];
  (this->m_3componentVertices).m_size = iVar7 + 1;
  pbVar4 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data;
  piVar1 = &pbVar4->m_numVertices;
  *piVar1 = *piVar1 + 1;
  pbVar4->m_vertexBase = (uchar *)pfVar10;
  uVar8 = (ulong)((iVar7 + 1) / 3 - 1);
LAB_0016c403:
  return (int)uVar8;
}

Assistant:

int	btTriangleMesh::findOrAddVertex(const btVector3& vertex, bool removeDuplicateVertices)
{
	//return index of new/existing vertex
	///@todo: could use acceleration structure for this
	if (m_use4componentVertices)
	{
		if (removeDuplicateVertices)
			{
			for (int i=0;i< m_4componentVertices.size();i++)
			{
				if ((m_4componentVertices[i]-vertex).length2() <= m_weldingThreshold)
				{
					return i;
				}
			}
		}
		m_indexedMeshes[0].m_numVertices++;
		m_4componentVertices.push_back(vertex);
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_4componentVertices[0];

		return m_4componentVertices.size()-1;
		
	} else
	{
		
		if (removeDuplicateVertices)
		{
			for (int i=0;i< m_3componentVertices.size();i+=3)
			{
				btVector3 vtx(m_3componentVertices[i],m_3componentVertices[i+1],m_3componentVertices[i+2]);
				if ((vtx-vertex).length2() <= m_weldingThreshold)
				{
					return i/3;
				}
			}
		}
		m_3componentVertices.push_back(vertex.getX());
		m_3componentVertices.push_back(vertex.getY());
		m_3componentVertices.push_back(vertex.getZ());
		m_indexedMeshes[0].m_numVertices++;
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_3componentVertices[0];
		return (m_3componentVertices.size()/3)-1;
	}

}